

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O3

REF_STATUS ref_export_tri(REF_GRID ref_grid,char *filename)

{
  size_t __size;
  REF_CELL pRVar1;
  REF_STATUS RVar2;
  FILE *__stream;
  void *__s;
  long lVar3;
  char *in_RDX;
  undefined8 uVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  REF_INT nodes [27];
  void *local_b8;
  int local_a8;
  int local_a4;
  int local_a0;
  uint local_9c;
  
  __stream = fopen(in_RDX,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n");
    pcVar7 = "unable to open file";
    uVar4 = 0xa11;
  }
  else {
    iVar5 = *(int *)((long)&ref_grid->mpi + 4);
    lVar8 = (long)iVar5;
    if (lVar8 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0xa13,"ref_export_tri","malloc o2n of REF_INT negative");
      return 1;
    }
    __size = lVar8 * 4;
    __s = malloc(__size);
    if (__s == (void *)0x0) {
      pcVar7 = "malloc o2n of REF_INT NULL";
      uVar4 = 0xa13;
    }
    else {
      if (iVar5 == 0) {
        local_b8 = malloc(__size);
        if (local_b8 != (void *)0x0) {
          fprintf(__stream,"%d %d\n",0,(ulong)*(uint *)(filename + 0x28));
          goto LAB_0016880c;
        }
      }
      else {
        memset(__s,0xff,__size);
        local_b8 = malloc(__size);
        if (local_b8 != (void *)0x0) {
          memset(local_b8,0xff,__size);
          pRVar1 = ref_grid->cell[0];
          lVar3 = 0;
          uVar6 = 0;
          do {
            if (((-1 < *(long *)(&pRVar1->type + lVar3 * 2)) &&
                (lVar3 < **(int **)(filename + 0x40))) &&
               (*(int *)(*(long *)(*(int **)(filename + 0x40) + 2) + lVar3 * 4) != -1)) {
              iVar5 = (int)uVar6;
              *(int *)((long)__s + lVar3 * 4) = iVar5;
              *(int *)((long)local_b8 + (long)iVar5 * 4) = (int)lVar3;
              uVar6 = (ulong)(iVar5 + 1);
            }
            lVar3 = lVar3 + 1;
          } while (lVar8 != lVar3);
          fprintf(__stream,"%d %d\n",uVar6,(ulong)*(uint *)(filename + 0x28));
          if (0 < (int)uVar6) {
            uVar9 = 0;
            do {
              pRVar1 = ref_grid->cell[5];
              lVar8 = (long)*(int *)((long)local_b8 + uVar9 * 4) * 0x78;
              fprintf(__stream,"%.16E %.16E %.16E\n",*(undefined8 *)((long)pRVar1 + lVar8),
                      *(undefined8 *)((long)pRVar1 + lVar8 + 8),
                      *(undefined8 *)((long)pRVar1 + lVar8 + 0x10));
              uVar9 = uVar9 + 1;
            } while (uVar6 != uVar9);
          }
LAB_0016880c:
          if (0 < *(int *)(filename + 0x2c)) {
            iVar5 = 0;
            do {
              RVar2 = ref_cell_nodes((REF_CELL)filename,iVar5,&local_a8);
              if (RVar2 == 0) {
                fprintf(__stream,"%d %d %d\n",(ulong)(*(int *)((long)__s + (long)local_a8 * 4) + 1),
                        (ulong)(*(int *)((long)__s + (long)local_a4 * 4) + 1),
                        (ulong)(*(int *)((long)__s + (long)local_a0 * 4) + 1));
              }
              iVar5 = iVar5 + 1;
            } while (iVar5 < *(int *)(filename + 0x2c));
            if (0 < *(int *)(filename + 0x2c)) {
              iVar5 = 0;
              do {
                RVar2 = ref_cell_nodes((REF_CELL)filename,iVar5,&local_a8);
                if (RVar2 == 0) {
                  fprintf(__stream,"%d\n",(ulong)local_9c);
                }
                iVar5 = iVar5 + 1;
              } while (iVar5 < *(int *)(filename + 0x2c));
            }
          }
          free(local_b8);
          free(__s);
          fclose(__stream);
          return 0;
        }
      }
      pcVar7 = "malloc n2o of REF_INT NULL";
      uVar4 = 0xa14;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar4,
         "ref_export_tri",pcVar7);
  return 2;
}

Assistant:

REF_FCN static REF_STATUS ref_export_tri(REF_GRID ref_grid,
                                         const char *filename) {
  FILE *f;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node, nnode;
  REF_INT *o2n, *n2o;
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc_init(n2o, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (!ref_cell_node_empty(ref_cell, node)) {
      o2n[node] = nnode;
      n2o[nnode] = node;
      nnode++;
    }
  }

  fprintf(f, "%d %d\n", nnode, ref_cell_n(ref_cell));
  for (node = 0; node < nnode; node++) {
    fprintf(f, "%.16E %.16E %.16E\n", ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 1, n2o[node]),
            ref_node_xyz(ref_node, 2, n2o[node]));
  }

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    fprintf(f, "%d %d %d\n", o2n[nodes[0]] + 1, o2n[nodes[1]] + 1,
            o2n[nodes[2]] + 1);
  }
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    fprintf(f, "%d\n", nodes[3]);
  }

  ref_free(n2o);
  ref_free(o2n);

  fclose(f);

  return REF_SUCCESS;
}